

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_c_api_tests.c
# Opt level: O2

void create_encoded_string_storage_from_DecodedResult_withMalformedInput_returnsNull(void)

{
  bech32_DecodedResult *decodedResult;
  bech32_bstring *pbVar1;
  char bstr [14];
  char acStack_18 [16];
  
  builtin_strncpy(acStack_18 + 8,"dvupm",6);
  builtin_strncpy(acStack_18,"xyz1pzr9",8);
  decodedResult = bech32_create_DecodedResult(acStack_18);
  decodedResult->hrplen = 0;
  pbVar1 = bech32_create_bstring_from_DecodedResult(decodedResult);
  if (pbVar1 == (bech32_bstring *)0x0) {
    bech32_free_DecodedResult(decodedResult);
    return;
  }
  __assert_fail("bstring == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                ,0x237,
                "void create_encoded_string_storage_from_DecodedResult_withMalformedInput_returnsNull(void)"
               );
}

Assistant:

void create_encoded_string_storage_from_DecodedResult_withMalformedInput_returnsNull(void) {
    // create a valid bech32_DecodedResult, then corrupt it for testing
    char bstr[] = "xyz1pzr9dvupm";
    bech32_DecodedResult *decodedResult = bech32_create_DecodedResult(bstr);

    // hrp too short
    decodedResult->hrplen = 0;
    bech32_bstring *bstring = bech32_create_bstring_from_DecodedResult(decodedResult);
    assert(bstring == NULL);

    bech32_free_DecodedResult(decodedResult);
}